

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_common.h
# Opt level: O0

void get_txb_ctx(BLOCK_SIZE plane_bsize,TX_SIZE tx_size,int plane,ENTROPY_CONTEXT *a,
                ENTROPY_CONTEXT *l,TXB_CTX *txb_ctx)

{
  undefined1 in_SIL;
  
  switch(in_SIL) {
  case 0:
    get_txb_ctx_4x4(plane_bsize,plane,a,l,txb_ctx);
    break;
  case 1:
    get_txb_ctx_8x8(plane_bsize,plane,a,l,txb_ctx);
    break;
  case 2:
    get_txb_ctx_16x16(plane_bsize,plane,a,l,txb_ctx);
    break;
  case 3:
    get_txb_ctx_32x32(plane_bsize,plane,a,l,txb_ctx);
    break;
  default:
    get_txb_ctx_general(plane_bsize,tx_size,plane,a,l,txb_ctx);
  }
  return;
}

Assistant:

static inline void get_txb_ctx(const BLOCK_SIZE plane_bsize,
                               const TX_SIZE tx_size, const int plane,
                               const ENTROPY_CONTEXT *const a,
                               const ENTROPY_CONTEXT *const l,
                               TXB_CTX *const txb_ctx) {
  switch (tx_size) {
    case TX_4X4: get_txb_ctx_4x4(plane_bsize, plane, a, l, txb_ctx); break;
    case TX_8X8: get_txb_ctx_8x8(plane_bsize, plane, a, l, txb_ctx); break;
    case TX_16X16: get_txb_ctx_16x16(plane_bsize, plane, a, l, txb_ctx); break;
    case TX_32X32: get_txb_ctx_32x32(plane_bsize, plane, a, l, txb_ctx); break;
    default:
      get_txb_ctx_general(plane_bsize, tx_size, plane, a, l, txb_ctx);
      break;
  }
}